

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  unsigned_short *ptr;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImFontGlyph *pIVar9;
  ImFontGlyph *pIVar10;
  float *pfVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  
  uVar14 = (this->Glyphs).Size;
  if (uVar14 == 0) {
    uVar13 = 1;
  }
  else {
    lVar16 = 0;
    uVar15 = 0;
    uVar13 = 0;
    do {
      if ((long)(int)uVar14 <= (long)uVar15) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        uVar14 = (this->Glyphs).Size;
      }
      uVar12 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar16) & 0x7fffffff;
      if (uVar13 <= uVar12) {
        uVar13 = uVar12;
      }
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 0x28;
    } while (uVar15 != uVar14);
    uVar13 = uVar13 + 1;
    if (0xfffe < (int)uVar14) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                  ,0xb04,"BuildLookupTable","ImGui ASSERT FAILED: %s","Glyphs.Size < 0xFFFF");
    }
  }
  pfVar11 = (this->IndexAdvanceX).Data;
  if (pfVar11 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar11);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  ptr = (this->IndexLookup).Data;
  if (ptr != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar13);
  uVar14 = (this->Glyphs).Size;
  uVar15 = (ulong)uVar14;
  if (0 < (int)uVar14) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      pIVar9 = (this->Glyphs).Data;
      uVar14 = *(uint *)(&pIVar9->field_0x0 + lVar17);
      if ((int)uVar15 <= lVar16) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        pIVar9 = (this->Glyphs).Data;
      }
      uVar12 = uVar14 & 0x7fffffff;
      fVar18 = *(float *)((long)&pIVar9->AdvanceX + lVar17);
      if ((this->IndexAdvanceX).Size <= (int)uVar12) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      (this->IndexAdvanceX).Data[uVar12] = fVar18;
      if ((this->IndexLookup).Size <= (int)uVar12) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      (this->IndexLookup).Data[uVar12] = (unsigned_short)lVar16;
      this->Used4kPagesMap[uVar12 >> 0xf] =
           this->Used4kPagesMap[uVar12 >> 0xf] | (byte)(1 << ((byte)(uVar14 >> 0xc) & 7));
      lVar16 = lVar16 + 1;
      uVar14 = (this->Glyphs).Size;
      uVar15 = (ulong)(int)uVar14;
      lVar17 = lVar17 + 0x28;
    } while (lVar16 < (long)uVar15);
  }
  uVar12 = (this->IndexLookup).Size;
  if ((uVar12 < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar9 = this->FallbackGlyph;
  }
  else {
    pIVar9 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar9 != (ImFontGlyph *)0x0) {
    if ((int)uVar14 < 1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
      uVar14 = (this->Glyphs).Size;
    }
    pIVar9 = (this->Glyphs).Data;
    if (((undefined1  [40])pIVar9[(long)(int)uVar14 + -1] & (undefined1  [40])0x7fffffff) !=
        (undefined1  [40])0x9) {
      uVar12 = uVar14 + 1;
      iVar2 = (this->Glyphs).Capacity;
      if (iVar2 <= (int)uVar14) {
        if (iVar2 == 0) {
          uVar14 = 8;
        }
        else {
          uVar14 = iVar2 / 2 + iVar2;
        }
        if ((int)uVar14 <= (int)uVar12) {
          uVar14 = uVar12;
        }
        pIVar9 = (ImFontGlyph *)ImGui::MemAlloc((long)(int)uVar14 * 0x28);
        pIVar10 = (this->Glyphs).Data;
        if (pIVar10 != (ImFontGlyph *)0x0) {
          memcpy(pIVar9,pIVar10,(long)(this->Glyphs).Size * 0x28);
          ImGui::MemFree((this->Glyphs).Data);
        }
        (this->Glyphs).Data = pIVar9;
        (this->Glyphs).Capacity = uVar14;
      }
      (this->Glyphs).Size = uVar12;
      uVar14 = uVar12;
    }
    if ((int)uVar14 < 1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
      uVar14 = (this->Glyphs).Size;
      pIVar9 = (this->Glyphs).Data;
    }
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar15 = (ulong)(this->IndexLookup).Data[0x20], uVar15 == 0xffff)) {
      pIVar10 = this->FallbackGlyph;
    }
    else {
      pIVar10 = pIVar9 + uVar15;
    }
    fVar18 = pIVar10->V1;
    pIVar9[(long)(int)uVar14 + -1].U1 = pIVar10->U1;
    pIVar9[(long)(int)uVar14 + -1].V1 = fVar18;
    uVar5 = *(undefined4 *)&pIVar10->field_0x0;
    fVar6 = pIVar10->AdvanceX;
    fVar7 = pIVar10->X0;
    fVar8 = pIVar10->Y0;
    fVar18 = pIVar10->Y1;
    fVar3 = pIVar10->U0;
    fVar4 = pIVar10->V0;
    pIVar9[(long)(int)uVar14 + -1].X1 = pIVar10->X1;
    pIVar9[(long)(int)uVar14 + -1].Y1 = fVar18;
    pIVar9[(long)(int)uVar14 + -1].U0 = fVar3;
    pIVar9[(long)(int)uVar14 + -1].V0 = fVar4;
    *(undefined4 *)&pIVar9[(long)(int)uVar14 + -1].field_0x0 = uVar5;
    pIVar9[(long)(int)uVar14 + -1].AdvanceX = fVar6;
    pIVar9[(long)(int)uVar14 + -1].X0 = fVar7;
    pIVar9[(long)(int)uVar14 + -1].Y0 = fVar8;
    *(uint *)(pIVar9 + (long)(int)uVar14 + -1) =
         *(uint *)(pIVar9 + (long)(int)uVar14 + -1) & 0x80000000 | 9;
    fVar18 = pIVar9[(long)(int)uVar14 + -1].AdvanceX * 4.0;
    pIVar9[(long)(int)uVar14 + -1].AdvanceX = fVar18;
    if ((this->IndexAdvanceX).Size < 10) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    (this->IndexAdvanceX).Data[9] = fVar18;
    uVar12 = (this->IndexLookup).Size;
    iVar2 = (this->Glyphs).Size;
    uVar14 = *(uint *)(pIVar9 + (long)(int)uVar14 + -1);
    if ((int)uVar12 <= (int)(uVar14 & 0x7fffffff)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      uVar12 = (this->IndexLookup).Size;
    }
    (this->IndexLookup).Data[uVar14 & 0x7fffffff] = (short)iVar2 - 1;
  }
  if ((uVar12 < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar9 = this->FallbackGlyph;
  }
  else {
    pIVar9 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar9 != (ImFontGlyph *)0x0) {
    pIVar9->field_0x3 = pIVar9->field_0x3 & 0x7f;
    uVar12 = (this->IndexLookup).Size;
  }
  if ((uVar12 < 10) || (uVar1 = (this->IndexLookup).Data[9], uVar1 == 0xffff)) {
    pIVar9 = this->FallbackGlyph;
  }
  else {
    pIVar9 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar9 != (ImFontGlyph *)0x0) {
    pIVar9->field_0x3 = pIVar9->field_0x3 & 0x7f;
    uVar12 = (this->IndexLookup).Size;
  }
  if (((ulong)this->FallbackChar < (ulong)(long)(int)uVar12) &&
     (uVar15 = (ulong)(this->IndexLookup).Data[this->FallbackChar], uVar15 != 0xffff)) {
    pIVar10 = (this->Glyphs).Data;
    pIVar9 = pIVar10 + uVar15;
    this->FallbackGlyph = pIVar9;
    if (pIVar10 != (ImFontGlyph *)0x0) {
      fVar18 = pIVar9->AdvanceX;
      goto LAB_001cfa04;
    }
  }
  else {
    this->FallbackGlyph = (ImFontGlyph *)0x0;
  }
  fVar18 = 0.0;
LAB_001cfa04:
  this->FallbackAdvanceX = fVar18;
  uVar15 = 0;
  do {
    if ((long)(this->IndexAdvanceX).Size <= (long)uVar15) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    pfVar11 = (this->IndexAdvanceX).Data;
    if (pfVar11[uVar15] <= 0.0 && pfVar11[uVar15] != 0.0) {
      fVar18 = this->FallbackAdvanceX;
      if ((long)(this->IndexAdvanceX).Size <= (long)uVar15) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        pfVar11 = (this->IndexAdvanceX).Data;
      }
      pfVar11[uVar15] = fVar18;
    }
    uVar15 = uVar15 + 1;
  } while (uVar13 != uVar15);
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}